

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O2

void __thiscall
DIS::AcousticEmitterSystemData::marshal(AcousticEmitterSystemData *this,DataStream *dataStream)

{
  undefined8 *puVar1;
  pointer pAVar2;
  ulong uVar3;
  long lVar4;
  AcousticBeamData x;
  
  DataStream::operator<<(dataStream,this->_emitterSystemDataLength);
  DataStream::operator<<
            (dataStream,
             (uchar)(((long)(this->_beamRecords).
                            super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_beamRecords).
                           super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  DataStream::operator<<(dataStream,this->_pad2);
  AcousticEmitterSystem::marshal(&this->_acousticEmitterSystem,dataStream);
  Vector3Float::marshal(&this->_emitterLocation,dataStream);
  lVar4 = 0x18;
  uVar3 = 0;
  while( true ) {
    pAVar2 = (this->_beamRecords).
             super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_beamRecords).
                       super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x30) <= uVar3)
    break;
    x._vptr_AcousticBeamData = (_func_int **)&PTR__AcousticBeamData_001b0090;
    x._8_4_ = *(undefined4 *)((long)pAVar2 + lVar4 + -0x10);
    x._fundamentalDataParameters._vptr_AcousticBeamFundamentalParameter =
         (_func_int **)&PTR__AcousticBeamFundamentalParameter_001b00d8;
    x._fundamentalDataParameters._deBeamwidth =
         *(float *)((long)&(pAVar2->_fundamentalDataParameters).
                           _vptr_AcousticBeamFundamentalParameter + lVar4);
    puVar1 = (undefined8 *)((long)&pAVar2->_vptr_AcousticBeamData + lVar4);
    x._fundamentalDataParameters._8_8_ = *puVar1;
    x._fundamentalDataParameters._16_8_ = puVar1[1];
    AcousticBeamData::marshal(&x,dataStream);
    AcousticBeamData::~AcousticBeamData(&x);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x30;
  }
  return;
}

Assistant:

void AcousticEmitterSystemData::marshal(DataStream& dataStream) const
{
    dataStream << _emitterSystemDataLength;
    dataStream << ( unsigned char )_beamRecords.size();
    dataStream << _pad2;
    _acousticEmitterSystem.marshal(dataStream);
    _emitterLocation.marshal(dataStream);

     for(size_t idx = 0; idx < _beamRecords.size(); idx++)
     {
        AcousticBeamData x = _beamRecords[idx];
        x.marshal(dataStream);
     }

}